

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<16>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  long lVar1;
  undefined8 in_RAX;
  long *plVar2;
  RepeatedField<long> *array;
  int index;
  undefined8 uStack_38;
  
  if (0 < *field) {
    index = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT44(md->tag,(undefined4)uStack_38);
      PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
      plVar2 = RepeatedField<long>::Get((RepeatedField<long> *)field,index);
      lVar1 = *plVar2;
      plVar2 = (long *)output->cur_;
      if ((output->impl_).end_ <= plVar2) {
        plVar2 = (long *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                   (&output->impl_,(uint8 *)plVar2);
      }
      *plVar2 = lVar1;
      output->cur_ = (uint8 *)(plVar2 + 1);
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }